

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O2

qint64 __thiscall
QGregorianCalendar::matchCenturyToWeekday(QGregorianCalendar *this,YearMonthDay *parts,int dow)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  longlong *plVar5;
  R_conflict16 RVar6;
  int iVar7;
  longlong lVar8;
  long in_FS_OFFSET;
  optional<long_long> oVar9;
  _Storage<long_long,_true> local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  oVar9 = julianFromParts(parts->year,parts->month,parts->day);
  local_48._M_value =
       oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  local_40 = (undefined1 *)
             CONCAT71(local_40._1_7_,
                      oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
                      super__Optional_payload_base<long_long>._M_engaged);
  if (((undefined1  [16])
       oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    lVar8 = -0x8000000000000000;
    if ((parts->month != 2) || (parts->day != 0x1d)) goto LAB_003131e7;
    iVar2 = parts->year - (parts->year >> 0x1f);
    RVar6 = QRoundingDown::qDivMod<100U,_int,_true>(iVar2);
    if ((ulong)RVar6 >> 0x20 != 0) goto LAB_003131e7;
    uVar3 = RVar6.quotient & 3;
    iVar4 = -100;
    if (uVar3 != 1) {
      iVar4 = (4 - uVar3) * 100;
    }
    iVar4 = iVar4 + iVar2;
LAB_003131ac:
    lVar8 = -0x8000000000000000;
    oVar9 = julianFromParts(iVar4 - (uint)(iVar4 < 1),parts->month,parts->day);
    local_48._M_value =
         oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>._M_payload;
    local_40 = (undefined1 *)
               CONCAT71(local_40._1_7_,
                        oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
                        super__Optional_payload_base<long_long>._M_engaged);
    if (((undefined1  [16])
         oVar9.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_003131e7;
    plVar5 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
             _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *)
                    &local_48);
    iVar2 = weekDayOfJulian(*plVar5);
    if (iVar2 != dow) goto LAB_003131e7;
  }
  else {
    plVar5 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
             _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *)
                    &local_48);
    iVar2 = weekDayOfJulian(*plVar5);
    iVar2 = iVar2 - dow;
    if (iVar2 != 0) {
      iVar7 = parts->year - (parts->year >> 0x1f);
      lVar8 = -0x8000000000000000;
      RVar6 = QRoundingDown::qDivMod<100U,_int,_true>(iVar7 - (uint)(parts->month < 3));
      iVar4 = QRoundingDown::qMod<7u,int>((RVar6.quotient & 3U) + iVar2 * 4);
      if (3 < iVar4) goto LAB_003131e7;
      iVar2 = QRoundingDown::qMod<7u,int>(iVar2);
      uVar1 = (long)(iVar2 + 3) / 2;
      iVar4 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 4) *
              100 + iVar7 + -100;
      goto LAB_003131ac;
    }
  }
  plVar5 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::_M_get
                     ((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *
                      )&local_48);
  lVar8 = *plVar5;
LAB_003131e7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar8;
  }
  __stack_chk_fail();
}

Assistant:

qint64
QGregorianCalendar::matchCenturyToWeekday(const QCalendar::YearMonthDay &parts, int dow) const
{
    /* The Gregorian four-century cycle is a whole number of weeks long, so we
       only need to consider four centuries, from previous through next-but-one.
       There are thus three days of the week that can't happen, for any given
       day-of-month, month and year-mod-100. (Exception: '00 Feb 29 has only one
       option.)
    */
    auto maybe = julianFromParts(parts.year, parts.month, parts.day);
    if (maybe) {
        int diff = weekDayOfJulian(*maybe) - dow;
        if (!diff)
            return *maybe;
        int year = parts.year < 0 ? parts.year + 1 : parts.year;
        // What matters is the placement of leap days, so dates before March
        // effectively belong with the dates since the preceding March:
        const auto yearSplit = qDivMod<100>(year - (parts.month < 3 ? 1 : 0));
        const int centuryMod4 = qMod<4>(yearSplit.quotient);
        // Week-day shift for a century is 5, unless crossing a multiple of 400's Feb 29th.
        static_assert(qMod<7>(36524) == 5); // and (3 * 5) % 7 = 1
        // Formulae arrived at by case-by-case analysis of the values of
        // centuryMod4 and diff (and the above clue to multiply by -3 = 4):
        if (qMod<7>(diff * 4 + centuryMod4) < 4) {
            // Century offset maps qMod<7>(diff) in {5, 6} to -1, {3, 4} to +2, and {1, 2} to +1:
            year += (((qMod<7>(diff) + 3) / 2) % 4 - 1) * 100;
            maybe = julianFromParts(year > 0 ? year : year - 1, parts.month, parts.day);
            if (maybe && weekDayOfJulian(*maybe) == dow)
                return *maybe;
            Q_ASSERT(parts.month == 2 && parts.day == 29
                     && dow != int(Qt::Tuesday) && !(year % 100));
        }

    } else if (parts.month == 2 && parts.day == 29) {
        int year = parts.year < 0 ? parts.year + 1 : parts.year;
        // Feb 29th on a century needs to resolve to a multiple of 400 years.
        const auto yearSplit = qDivMod<100>(year);
        if (!yearSplit.remainder) {
            const auto centuryMod4 = qMod<4>(yearSplit.quotient);
            Q_ASSERT(centuryMod4); // or we'd have got a valid date to begin with.
            if (centuryMod4 == 1) // round down
                year -= 100;
            else // 2 or 3; round up
                year += (4 - centuryMod4) * 100;
            maybe = julianFromParts(year > 0 ? year : year - 1, parts.month, parts.day);
            if (maybe && weekDayOfJulian(*maybe) == dow) // (Can only happen for Tuesday.)
                return *maybe;
            Q_ASSERT(dow != int(Qt::Tuesday));
        }
    }
    return (std::numeric_limits<qint64>::min)();
}